

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_tracing.cpp
# Opt level: O3

spv_result_t spvtools::val::RayTracingPass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  uint16_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  Op OVar5;
  uint32_t uVar6;
  uint uVar7;
  StorageClass SVar8;
  Function *pFVar9;
  _Node *p_Var10;
  Instruction *pIVar11;
  long lVar12;
  char *pcVar13;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 == 0x14d6) {
    uVar4 = (inst->inst_).type_id;
    pFVar9 = ValidationState_t::function(_,inst->function_->id_);
    local_248._M_unused._M_object = (void *)0x0;
    local_248._8_8_ = 0;
    local_230 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_ray_tracing.cpp:129:15)>
                ::_M_invoke;
    local_238 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_ray_tracing.cpp:129:15)>
                ::_M_manager;
    p_Var10 = std::__cxx11::
              list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                          *)&pFVar9->execution_model_limitations_,
                         (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_248);
    std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
    psVar1 = &(pFVar9->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_238 != (code *)0x0) {
      (*local_238)(&local_248,&local_248,__destroy_functor);
    }
    bVar3 = ValidationState_t::IsBoolScalarType(_,uVar4);
    if (bVar3) {
      uVar4 = ValidationState_t::GetOperandTypeId(_,inst,2);
      bVar3 = ValidationState_t::IsFloatScalarType(_,uVar4);
      if ((bVar3) && (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20)) {
        uVar4 = ValidationState_t::GetOperandTypeId(_,inst,3);
        bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar4);
        if ((bVar3) && (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20)) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar13 = "Hit Kind must be a 32-bit unsigned int scalar";
        lVar12 = 0x2d;
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar13 = "Hit must be a 32-bit int scalar";
        lVar12 = 0x1f;
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar13 = "expected Result Type to be bool scalar type";
      lVar12 = 0x2b;
    }
  }
  else {
    if (uVar2 != 0x115e) {
      if (uVar2 != 0x115d) {
        return SPV_SUCCESS;
      }
      pFVar9 = ValidationState_t::function(_,inst->function_->id_);
      local_228._M_unused._M_object = (void *)0x0;
      local_228._8_8_ = 0;
      local_210 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_ray_tracing.cpp:33:15)>
                  ::_M_invoke;
      local_218 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_ray_tracing.cpp:33:15)>
                  ::_M_manager;
      p_Var10 = std::__cxx11::
                list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                ::
                _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                          ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                            *)&pFVar9->execution_model_limitations_,
                           (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                            *)&local_228);
      std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
      psVar1 = &(pFVar9->execution_model_limitations_).
                super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_218 != (code *)0x0) {
        (*local_218)(&local_228,&local_228,__destroy_functor);
      }
      uVar4 = ValidationState_t::GetOperandTypeId(_,inst,0);
      OVar5 = ValidationState_t::GetIdOpcode(_,uVar4);
      if (OVar5 != OpTypeAccelerationStructureKHR) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar13 = "Expected Acceleration Structure to be of type OpTypeAccelerationStructureKHR";
        lVar12 = 0x4c;
        goto LAB_002f6f7b;
      }
      uVar4 = ValidationState_t::GetOperandTypeId(_,inst,1);
      bVar3 = ValidationState_t::IsIntScalarType(_,uVar4);
      if ((bVar3) && (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20)) {
        uVar4 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar3 = ValidationState_t::IsIntScalarType(_,uVar4);
        if ((!bVar3) || (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 != 0x20)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar13 = "Cull Mask must be a 32-bit int scalar";
          goto LAB_002f6f76;
        }
        uVar4 = ValidationState_t::GetOperandTypeId(_,inst,3);
        bVar3 = ValidationState_t::IsIntScalarType(_,uVar4);
        if ((bVar3) && (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20)) {
          uVar4 = ValidationState_t::GetOperandTypeId(_,inst,4);
          bVar3 = ValidationState_t::IsIntScalarType(_,uVar4);
          if ((!bVar3) || (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 != 0x20)) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar13 = "SBT Stride must be a 32-bit int scalar";
            goto LAB_002f7020;
          }
          uVar4 = ValidationState_t::GetOperandTypeId(_,inst,5);
          bVar3 = ValidationState_t::IsIntScalarType(_,uVar4);
          if ((!bVar3) || (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 != 0x20)) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar13 = "Miss Index must be a 32-bit int scalar";
            goto LAB_002f7020;
          }
          uVar4 = ValidationState_t::GetOperandTypeId(_,inst,6);
          bVar3 = ValidationState_t::IsFloatVectorType(_,uVar4);
          if (((bVar3) && (uVar6 = ValidationState_t::GetDimension(_,uVar4), uVar6 == 3)) &&
             (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20)) {
            uVar4 = ValidationState_t::GetOperandTypeId(_,inst,7);
            bVar3 = ValidationState_t::IsFloatScalarType(_,uVar4);
            if ((!bVar3) || (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 != 0x20)) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar13 = "Ray TMin must be a 32-bit float scalar";
              goto LAB_002f7020;
            }
            uVar4 = ValidationState_t::GetOperandTypeId(_,inst,8);
            bVar3 = ValidationState_t::IsFloatVectorType(_,uVar4);
            if (((bVar3) && (uVar6 = ValidationState_t::GetDimension(_,uVar4), uVar6 == 3)) &&
               (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20)) {
              uVar4 = ValidationState_t::GetOperandTypeId(_,inst,9);
              bVar3 = ValidationState_t::IsFloatScalarType(_,uVar4);
              if ((!bVar3) || (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 != 0x20)) {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar13 = "Ray TMax must be a 32-bit float scalar";
                goto LAB_002f7020;
              }
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,10);
              pIVar11 = ValidationState_t::FindDef(_,uVar7);
              if ((pIVar11->inst_).opcode == 0x3b) {
                SVar8 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,2);
                if (SVar8 == RayPayloadKHR) {
                  return SPV_SUCCESS;
                }
                SVar8 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,2);
                if (SVar8 == IncomingRayPayloadKHR) {
                  return SPV_SUCCESS;
                }
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar13 = "Payload must have storage class RayPayloadKHR or IncomingRayPayloadKHR";
                lVar12 = 0x46;
              }
              else {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar13 = "Payload must be the result of a OpVariable";
                lVar12 = 0x2a;
              }
            }
            else {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar13 = "Ray Direction must be a 32-bit float 3-component vector";
              lVar12 = 0x37;
            }
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar13 = "Ray Origin must be a 32-bit float 3-component vector";
            lVar12 = 0x34;
          }
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar13 = "SBT Offset must be a 32-bit int scalar";
LAB_002f7020:
          lVar12 = 0x26;
        }
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar13 = "Ray Flags must be a 32-bit int scalar";
LAB_002f6f76:
        lVar12 = 0x25;
      }
LAB_002f6f7b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar13,lVar12);
      goto LAB_002f6fc4;
    }
    pFVar9 = ValidationState_t::function(_,inst->function_->id_);
    local_268._M_unused._M_object = (void *)0x0;
    local_268._8_8_ = 0;
    local_250 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_ray_tracing.cpp:163:46)>
                ::_M_invoke;
    local_258 = std::
                _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_ray_tracing.cpp:163:46)>
                ::_M_manager;
    p_Var10 = std::__cxx11::
              list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              ::_M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                        ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                          *)&pFVar9->execution_model_limitations_,
                         (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                          *)&local_268);
    std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
    psVar1 = &(pFVar9->execution_model_limitations_).
              super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_258 != (code *)0x0) {
      (*local_258)(&local_268,&local_268,__destroy_functor);
    }
    uVar4 = ValidationState_t::GetOperandTypeId(_,inst,0);
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar4);
    if ((bVar3) && (uVar4 = ValidationState_t::GetBitWidth(_,uVar4), uVar4 == 0x20)) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
      pIVar11 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar11->inst_).opcode == 0x3b) {
        SVar8 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,2);
        if (SVar8 == CallableDataKHR) {
          return SPV_SUCCESS;
        }
        SVar8 = Instruction::GetOperandAs<spv::StorageClass>(pIVar11,2);
        if (SVar8 == IncomingCallableDataKHR) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar13 = "Callable Data must have storage class CallableDataKHR or IncomingCallableDataKHR"
        ;
        lVar12 = 0x50;
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar13 = "Callable Data must be the result of a OpVariable";
        lVar12 = 0x30;
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar13 = "SBT Index must be a 32-bit unsigned int scalar";
      lVar12 = 0x2e;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar13,lVar12);
LAB_002f6fc4:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t RayTracingPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpTraceRayKHR: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR &&
                    model != spv::ExecutionModel::ClosestHitKHR &&
                    model != spv::ExecutionModel::MissKHR) {
                  if (message) {
                    *message =
                        "OpTraceRayKHR requires RayGenerationKHR, "
                        "ClosestHitKHR and MissKHR execution models";
                  }
                  return false;
                }
                return true;
              });

      if (_.GetIdOpcode(_.GetOperandTypeId(inst, 0)) !=
          spv::Op::OpTypeAccelerationStructureKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Acceleration Structure to be of type "
                  "OpTypeAccelerationStructureKHR";
      }

      const uint32_t ray_flags = _.GetOperandTypeId(inst, 1);
      if (!_.IsIntScalarType(ray_flags) || _.GetBitWidth(ray_flags) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Flags must be a 32-bit int scalar";
      }

      const uint32_t cull_mask = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(cull_mask) || _.GetBitWidth(cull_mask) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Cull Mask must be a 32-bit int scalar";
      }

      const uint32_t sbt_offset = _.GetOperandTypeId(inst, 3);
      if (!_.IsIntScalarType(sbt_offset) || _.GetBitWidth(sbt_offset) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "SBT Offset must be a 32-bit int scalar";
      }

      const uint32_t sbt_stride = _.GetOperandTypeId(inst, 4);
      if (!_.IsIntScalarType(sbt_stride) || _.GetBitWidth(sbt_stride) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "SBT Stride must be a 32-bit int scalar";
      }

      const uint32_t miss_index = _.GetOperandTypeId(inst, 5);
      if (!_.IsIntScalarType(miss_index) || _.GetBitWidth(miss_index) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Miss Index must be a 32-bit int scalar";
      }

      const uint32_t ray_origin = _.GetOperandTypeId(inst, 6);
      if (!_.IsFloatVectorType(ray_origin) || _.GetDimension(ray_origin) != 3 ||
          _.GetBitWidth(ray_origin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Origin must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmin = _.GetOperandTypeId(inst, 7);
      if (!_.IsFloatScalarType(ray_tmin) || _.GetBitWidth(ray_tmin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMin must be a 32-bit float scalar";
      }

      const uint32_t ray_direction = _.GetOperandTypeId(inst, 8);
      if (!_.IsFloatVectorType(ray_direction) ||
          _.GetDimension(ray_direction) != 3 ||
          _.GetBitWidth(ray_direction) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Direction must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmax = _.GetOperandTypeId(inst, 9);
      if (!_.IsFloatScalarType(ray_tmax) || _.GetBitWidth(ray_tmax) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMax must be a 32-bit float scalar";
      }

      const Instruction* payload = _.FindDef(inst->GetOperandAs<uint32_t>(10));
      if (payload->opcode() != spv::Op::OpVariable) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Payload must be the result of a OpVariable";
      } else if (payload->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::RayPayloadKHR &&
                 payload->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::IncomingRayPayloadKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Payload must have storage class RayPayloadKHR or "
                  "IncomingRayPayloadKHR";
      }
      break;
    }

    case spv::Op::OpReportIntersectionKHR: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::IntersectionKHR) {
                  if (message) {
                    *message =
                        "OpReportIntersectionKHR requires IntersectionKHR "
                        "execution model";
                  }
                  return false;
                }
                return true;
              });

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be bool scalar type";
      }

      const uint32_t hit = _.GetOperandTypeId(inst, 2);
      if (!_.IsFloatScalarType(hit) || _.GetBitWidth(hit) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit must be a 32-bit int scalar";
      }

      const uint32_t hit_kind = _.GetOperandTypeId(inst, 3);
      if (!_.IsUnsignedIntScalarType(hit_kind) ||
          _.GetBitWidth(hit_kind) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit Kind must be a 32-bit unsigned int scalar";
      }
      break;
    }

    case spv::Op::OpExecuteCallableKHR: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation([](spv::ExecutionModel model,
                                                std::string* message) {
            if (model != spv::ExecutionModel::RayGenerationKHR &&
                model != spv::ExecutionModel::ClosestHitKHR &&
                model != spv::ExecutionModel::MissKHR &&
                model != spv::ExecutionModel::CallableKHR) {
              if (message) {
                *message =
                    "OpExecuteCallableKHR requires RayGenerationKHR, "
                    "ClosestHitKHR, MissKHR and CallableKHR execution models";
              }
              return false;
            }
            return true;
          });

      const uint32_t sbt_index = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(sbt_index) ||
          _.GetBitWidth(sbt_index) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "SBT Index must be a 32-bit unsigned int scalar";
      }

      const auto callable_data = _.FindDef(inst->GetOperandAs<uint32_t>(1));
      if (callable_data->opcode() != spv::Op::OpVariable) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Callable Data must be the result of a OpVariable";
      } else if (callable_data->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::CallableDataKHR &&
                 callable_data->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::IncomingCallableDataKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Callable Data must have storage class CallableDataKHR or "
                  "IncomingCallableDataKHR";
      }

      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}